

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_stream_split_decoder.cpp
# Opt level: O0

void __thiscall
duckdb::ByteStreamSplitDecoder::Skip(ByteStreamSplitDecoder *this,uint8_t *defines,idx_t skip_count)

{
  ParquetColumnSchema *pPVar1;
  runtime_error *this_00;
  ColumnReader *in_RDX;
  undefined8 *in_RDI;
  idx_t valid_count;
  uint32_t in_stack_000001ac;
  BssDecoder *in_stack_000001b0;
  unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>
  *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  idx_t in_stack_ffffffffffffffd8;
  uint8_t *in_stack_ffffffffffffffe0;
  
  ColumnReader::GetValidCount
            (in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  pPVar1 = ColumnReader::Schema((ColumnReader *)*in_RDI);
  if (pPVar1->parquet_type == FLOAT) {
    unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::operator->
              (in_stack_ffffffffffffffc0);
    BssDecoder::Skip<float>(in_stack_000001b0,in_stack_000001ac);
  }
  else {
    if (pPVar1->parquet_type != DOUBLE) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_00,"BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
      __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::operator->
              (in_stack_ffffffffffffffc0);
    BssDecoder::Skip<double>(in_stack_000001b0,in_stack_000001ac);
  }
  return;
}

Assistant:

void ByteStreamSplitDecoder::Skip(uint8_t *defines, idx_t skip_count) {
	idx_t valid_count = reader.GetValidCount(defines, skip_count);
	switch (reader.Schema().parquet_type) {
	case duckdb_parquet::Type::FLOAT:
		bss_decoder->Skip<float>(valid_count);
		break;
	case duckdb_parquet::Type::DOUBLE:
		bss_decoder->Skip<double>(valid_count);
		break;
	default:
		throw std::runtime_error("BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
	}
}